

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::ReadDataFromListSegment
               (ListSegmentFunctions *functions,ListSegment *segment,Vector *result,
               idx_t *total_count)

{
  idx_t *piVar1;
  ushort uVar2;
  ushort uVar3;
  Vector *result_00;
  const_reference this;
  data_ptr_t pdVar4;
  long lVar5;
  idx_t i;
  ulong uVar6;
  idx_t required_capacity;
  idx_t total_count_00;
  LinkedList linked_child_list;
  LinkedList local_48;
  
  FlatVector::VerifyFlatVector(result);
  for (uVar6 = 0; uVar2 = segment->count, uVar6 < uVar2; uVar6 = uVar6 + 1) {
    if (*(char *)((long)&segment[1].count + uVar6) == '\x01') {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,*total_count + uVar6
                );
    }
  }
  pdVar4 = result->data;
  if (*total_count == 0) {
    total_count_00 = 0;
  }
  else {
    lVar5 = *total_count * 0x10;
    total_count_00 = *(long *)(pdVar4 + lVar5 + -8) + *(long *)(pdVar4 + lVar5 + -0x10);
  }
  uVar3 = segment->capacity;
  pdVar4 = pdVar4 + 8;
  required_capacity = total_count_00;
  for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    lVar5 = *(long *)((long)&segment[1].count + uVar6 * 8 + (ulong)uVar3);
    *(long *)(pdVar4 + *total_count * 0x10) = lVar5;
    *(idx_t *)(pdVar4 + *total_count * 0x10 + -8) = required_capacity;
    required_capacity = required_capacity + lVar5;
    pdVar4 = pdVar4 + 0x10;
  }
  result_00 = ListVector::GetEntryInternal<duckdb::Vector>(result);
  lVar5 = (ulong)segment->capacity * 9;
  local_48.last_segment = *(ListSegment **)((long)&segment[2].count + lVar5);
  piVar1 = (idx_t *)((long)&segment[1].count + lVar5);
  local_48.total_capacity = *piVar1;
  local_48.first_segment = (ListSegment *)piVar1[1];
  ListVector::Reserve(result,required_capacity);
  this = vector<duckdb::ListSegmentFunctions,_true>::get<true>(&functions->child_functions,0);
  ListSegmentFunctions::BuildListVector(this,&local_48,result_00,total_count_00);
  ListVector::SetListSize(result,required_capacity);
  return;
}

Assistant:

static void ReadDataFromListSegment(const ListSegmentFunctions &functions, const ListSegment *segment, Vector &result,
                                    idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto list_vector_data = FlatVector::GetData<list_entry_t>(result);

	// get the starting offset
	idx_t offset = 0;
	if (total_count != 0) {
		offset = list_vector_data[total_count - 1].offset + list_vector_data[total_count - 1].length;
	}
	idx_t starting_offset = offset;

	// set length and offsets
	auto list_length_data = GetListLengthData(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		auto list_length = Load<uint64_t>(const_data_ptr_cast(list_length_data + i));
		list_vector_data[total_count + i].length = list_length;
		list_vector_data[total_count + i].offset = offset;
		offset += list_length;
	}

	auto &child_vector = ListVector::GetEntry(result);
	auto linked_child_list = Load<LinkedList>(const_data_ptr_cast(GetListChildData(segment)));
	ListVector::Reserve(result, offset);

	// recurse into the linked list of child values
	D_ASSERT(functions.child_functions.size() == 1);
	functions.child_functions[0].BuildListVector(linked_child_list, child_vector, starting_offset);
	ListVector::SetListSize(result, offset);
}